

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

ImPlotLimits * ImPlot::GetPlotQuery(ImPlotLimits *__return_storage_ptr__,ImPlotYAxis y_axis)

{
  ImPlotPlot *pIVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImPlotPoint IVar6;
  
  if (3 < y_axis + 1U) {
    __assert_fail("(y_axis >= -1 && y_axis < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xac1,"ImPlotLimits ImPlot::GetPlotQuery(ImPlotYAxis)");
  }
  pIVar1 = GImPlot->CurrentPlot;
  if (pIVar1 != (ImPlotPlot *)0x0) {
    if (y_axis < 0) {
      y_axis = pIVar1->CurrentYAxis;
    }
    if (pIVar1->Queried == false) {
      (__return_storage_ptr__->Y).Min = 0.0;
      (__return_storage_ptr__->Y).Max = 0.0;
      (__return_storage_ptr__->X).Min = 0.0;
      (__return_storage_ptr__->X).Max = 0.0;
    }
    else {
      UpdateTransformCache();
      IVar6 = PixelsToPlot((pIVar1->QueryRect).Min.x + (pIVar1->PlotRect).Min.x,
                           (pIVar1->QueryRect).Min.y + (pIVar1->PlotRect).Min.y,y_axis);
      dVar3 = IVar6.x;
      dVar2 = IVar6.y;
      IVar6 = PixelsToPlot((pIVar1->QueryRect).Max.x + (pIVar1->PlotRect).Min.x,
                           (pIVar1->QueryRect).Max.y + (pIVar1->PlotRect).Min.y,y_axis);
      dVar4 = IVar6.x;
      (__return_storage_ptr__->X).Min = 0.0;
      (__return_storage_ptr__->X).Max = 0.0;
      (__return_storage_ptr__->Y).Min = 0.0;
      (__return_storage_ptr__->Y).Max = 0.0;
      dVar5 = dVar3;
      if (dVar4 <= dVar3) {
        dVar5 = dVar4;
      }
      (__return_storage_ptr__->X).Min = dVar5;
      (__return_storage_ptr__->X).Max =
           (double)(~-(ulong)(dVar4 <= dVar3) & (ulong)dVar4 |
                   (ulong)dVar3 & -(ulong)(dVar4 <= dVar3));
      dVar5 = IVar6.y;
      dVar3 = dVar2;
      if (dVar5 <= dVar2) {
        dVar3 = dVar5;
      }
      (__return_storage_ptr__->Y).Min = dVar3;
      (__return_storage_ptr__->Y).Max =
           (double)(~-(ulong)(dVar5 <= dVar2) & (ulong)dVar5 |
                   (ulong)dVar2 & -(ulong)(dVar5 <= dVar2));
    }
    return __return_storage_ptr__;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xac2,"ImPlotLimits ImPlot::GetPlotQuery(ImPlotYAxis)");
}

Assistant:

ImPlotLimits GetPlotQuery(ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis >= -1 && y_axis < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!");
    ImPlotPlot& plot = *gp.CurrentPlot;
    y_axis = y_axis >= 0 ? y_axis : gp.CurrentPlot->CurrentYAxis;
    if (!plot.Queried)
        return ImPlotLimits(0,0,0,0);
    UpdateTransformCache();
    ImPlotPoint p1 = PixelsToPlot(plot.QueryRect.Min + plot.PlotRect.Min, y_axis);
    ImPlotPoint p2 = PixelsToPlot(plot.QueryRect.Max + plot.PlotRect.Min, y_axis);
    ImPlotLimits result;
    result.X.Min = ImMin(p1.x, p2.x);
    result.X.Max = ImMax(p1.x, p2.x);
    result.Y.Min = ImMin(p1.y, p2.y);
    result.Y.Max = ImMax(p1.y, p2.y);
    return result;
}